

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O3

void KeccakP1600_ExtractBytes(void *state,uchar *data,uint offset,uint length)

{
  uint uVar1;
  uint uVar2;
  uint _sizeLeft;
  uint uVar3;
  ulong __n;
  uchar *_curData;
  uint64_t lane1 [1];
  undefined8 local_30;
  
  if (offset == 0) {
    __n = (ulong)(length & 0xfffffff8);
    memcpy(data,state,__n);
    local_30 = *(undefined8 *)((long)state + __n);
    memcpy(data + __n,&local_30,(ulong)(length & 7));
  }
  else if (length != 0) {
    uVar2 = offset & 7;
    uVar3 = offset >> 3;
    do {
      local_30 = *(undefined8 *)((long)state + (ulong)uVar3 * 8);
      uVar1 = 8 - uVar2;
      if (length <= 8 - uVar2) {
        uVar1 = length;
      }
      memcpy(data,(void *)((long)&local_30 + (ulong)uVar2),(ulong)uVar1);
      uVar3 = uVar3 + 1;
      data = data + uVar1;
      uVar2 = 0;
      length = length - uVar1;
    } while (length != 0);
  }
  return;
}

Assistant:

void KeccakP1600_ExtractBytes(const void *state, unsigned char *data, unsigned int offset, unsigned int length)
{
    SnP_ExtractBytes(state, data, offset, length, KeccakP1600_ExtractLanes, KeccakP1600_ExtractBytesInLane, 8);
}